

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

void __thiscall QString::reallocGrowData(QString *this,qsizetype n)

{
  bool bVar1;
  char16_t *pcVar2;
  QPodArrayOps<char16_t> *this_00;
  QArrayDataPointer<char16_t> *pQVar3;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition unaff_retaddr;
  qsizetype in_stack_00000008;
  QArrayDataPointer<char16_t> *in_stack_00000010;
  DataPointer dd;
  AllocationOption in_stack_ffffffffffffff9c;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffffa0;
  QPodArrayOps<char16_t> *in_stack_ffffffffffffffa8;
  QArrayDataPointer<char16_t> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QArrayDataPointer<char16_t>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<char16_t>::needsDetach(in_stack_ffffffffffffffa0);
  if (bVar1) {
    local_20.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<char16_t>::allocateGrow(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    pcVar2 = QArrayDataPointer<char16_t>::data(&local_20);
    if (pcVar2 == (char16_t *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        qBadAlloc();
      }
      goto LAB_00508a26;
    }
    pQVar3 = (QArrayDataPointer<char16_t> *)QArrayDataPointer<char16_t>::operator->(&local_20);
    this_00 = (QPodArrayOps<char16_t> *)QArrayDataPointer<char16_t>::data(in_RDI);
    QArrayDataPointer<char16_t>::data(in_RDI);
    QtPrivate::QPodArrayOps<char16_t>::copyAppend
              (this_00,(char16_t *)pQVar3,(char16_t *)in_stack_ffffffffffffffa0);
    pcVar2 = QArrayDataPointer<char16_t>::data(&local_20);
    pcVar2[local_20.size] = L'\0';
    QArrayDataPointer<char16_t>::operator=(pQVar3,in_stack_ffffffffffffffa0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_ffffffffffffffa0);
  }
  else {
    pQVar3 = (QArrayDataPointer<char16_t> *)QArrayDataPointer<char16_t>::operator->(in_RDI);
    QArrayDataPointer<char16_t>::constAllocatedCapacity(pQVar3);
    QtPrivate::QPodArrayOps<char16_t>::reallocate
              (in_stack_ffffffffffffffa8,(qsizetype)pQVar3,in_stack_ffffffffffffff9c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_00508a26:
  __stack_chk_fail();
}

Assistant:

void QString::reallocGrowData(qsizetype n)
{
    if (!n)  // expected to always allocate
        n = 1;

    if (d->needsDetach()) {
        DataPointer dd(DataPointer::allocateGrow(d, n, QArrayData::GrowsAtEnd));
        Q_CHECK_PTR(dd.data());
        dd->copyAppend(d.data(), d.data() + d.size);
        dd.data()[dd.size] = 0;
        d = dd;
    } else {
        d->reallocate(d.constAllocatedCapacity() + n, QArrayData::Grow);
    }
}